

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O1

void lower_bound_sorted_suite::find_odd_last_predicate(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  array<int,_5UL> storage;
  int *local_38;
  int *local_30;
  int local_28 [6];
  
  local_30 = local_28;
  local_28[0] = 0x37;
  local_28[1] = 0x2c;
  local_28[2] = 0x21;
  local_28[3] = 0x16;
  local_28[4] = 0xb;
  lVar1 = 5;
  do {
    lVar2 = lVar1 >> 1;
    lVar3 = lVar2;
    if (local_30[lVar2] < 0xd) {
      lVar3 = 0;
    }
    local_30 = local_30 + lVar3;
    lVar1 = lVar1 - lVar2;
  } while (1 < lVar1);
  local_30 = local_30 + (0xc < *local_30);
  local_38 = local_28 + 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 12, std::greater<int>{})",
             "std::next(storage.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x41f,"void lower_bound_sorted_suite::find_odd_last_predicate()",&local_30,&local_38);
  lVar1 = 5;
  local_30 = local_28;
  do {
    lVar2 = lVar1 >> 1;
    lVar3 = lVar2;
    if (local_30[lVar2] < 0xc) {
      lVar3 = 0;
    }
    local_30 = local_30 + lVar3;
    lVar1 = lVar1 - lVar2;
  } while (1 < lVar1);
  local_30 = local_30 + (0xb < *local_30);
  local_38 = local_28 + 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 11, std::greater<int>{})",
             "std::next(storage.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x421,"void lower_bound_sorted_suite::find_odd_last_predicate()",&local_30,&local_38);
  lVar1 = 5;
  local_30 = local_28;
  do {
    lVar2 = lVar1 >> 1;
    lVar3 = lVar2;
    if (local_30[lVar2] < 0xb) {
      lVar3 = 0;
    }
    local_30 = local_30 + lVar3;
    lVar1 = lVar1 - lVar2;
  } while (1 < lVar1);
  local_38 = local_28 + 5;
  local_30 = local_30 + (10 < *local_30);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 10, std::greater<int>{})",
             "storage.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x423,"void lower_bound_sorted_suite::find_odd_last_predicate()",&local_30,&local_38);
  return;
}

Assistant:

void find_odd_last_predicate()
{
    std::array<int, 5> storage = { 55, 44, 33, 22, 11 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 12, std::greater<int>{}),
                  std::next(storage.begin(), 4));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 11, std::greater<int>{}),
                  std::next(storage.begin(), 4));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 10, std::greater<int>{}),
                  storage.end());
}